

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall t_rs_generator::init_generator(t_rs_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  long *plVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *pcVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  string f_gen_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  iVar2 = mkdir((this->gen_dir_)._M_dataplus._M_p,0x1ff);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_b0,(this->gen_dir_)._M_dataplus._M_p,(allocator *)&local_70);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_90._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
        local_90.field_2._M_allocated_capacity = *psVar8;
        local_90.field_2._8_8_ = plVar5[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar8;
      }
      local_90._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pcVar7 = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&local_90,pcVar7);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  pcVar1 = (this->gen_dir_)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->gen_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  rust_snake_case(&local_50,this,&((this->super_t_generator).program_)->name_);
  uVar9 = 0xf;
  if (local_70 != local_60) {
    uVar9 = local_60[0];
  }
  if (uVar9 < local_50._M_string_length + local_68) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar10 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_68 <= (ulong)uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_0032e68b;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
LAB_0032e68b:
  local_b0 = (char *)&local_a0;
  pcVar7 = (char *)(puVar4 + 2);
  if ((char *)*puVar4 == pcVar7) {
    local_a0 = *(undefined8 *)pcVar7;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *(undefined8 *)pcVar7;
    local_b0 = (char *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = pcVar7;
  puVar4[1] = 0;
  *pcVar7 = '\0';
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90.field_2._8_8_ = plVar5[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_b0 != (char *)&local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::string::string((string *)&local_b0,local_90._M_dataplus._M_p,(allocator *)&local_70)
  ;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_gen_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  this_00 = &this->f_gen_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_gen_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       0;
  if (local_b0 != (char *)&local_a0) {
    operator_delete(local_b0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"// ",3);
  (*(this->super_t_generator)._vptr_t_generator[0x1d])(&local_b0,this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_b0 != (char *)&local_a0) {
    operator_delete(local_b0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "// DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  render_attributes_and_includes(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::init_generator() {
  // make output directory for this thrift program
  MKDIR(gen_dir_.c_str());

  // create the file into which we're going to write the generated code
  string f_gen_name = gen_dir_ + "/" + rust_snake_case(get_program()->get_name()) + ".rs";
  f_gen_.open(f_gen_name.c_str());

  // header comment
  f_gen_ << "// " << autogen_summary() << endl;
  f_gen_ << "// DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING" << endl;
  f_gen_ << endl;

  render_attributes_and_includes();
}